

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O3

void __thiscall cmRST::OutputLine(cmRST *this,string *line_in,bool inlineMarkup)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  ulong *puVar8;
  long lVar9;
  string text;
  size_type lit_start;
  size_type role_start;
  string line;
  char *local_d0;
  long local_c8;
  char local_c0;
  undefined7 uStack_bf;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  ulong local_90;
  ulong local_88;
  string local_80;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  RegularExpression *local_40;
  RegularExpression *local_38;
  
  if (this->OutputLinePending == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->OS,"\n",1);
    this->OutputLinePending = false;
  }
  if (!inlineMarkup) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->OS,(line_in->_M_dataplus)._M_p,line_in->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    return;
  }
  ReplaceSubstitutions(&local_80,this,line_in);
  local_38 = &this->CMakeRole;
  local_40 = &this->InlineLiteral;
  lVar9 = 0;
  do {
    local_88 = 0xffffffffffffffff;
    local_90 = 0xffffffffffffffff;
    bVar3 = cmsys::RegularExpression::find
                      (local_38,local_80._M_dataplus._M_p + lVar9,&local_38->regmatch);
    if (bVar3) {
      local_88 = (long)(this->CMakeRole).regmatch.startp[0] -
                 (long)(this->CMakeRole).regmatch.searchstring;
      puVar8 = &local_88;
    }
    else {
      puVar8 = (ulong *)0x0;
    }
    bVar3 = cmsys::RegularExpression::find
                      (local_40,local_80._M_dataplus._M_p + lVar9,&local_40->regmatch);
    if (bVar3) {
      local_90 = (long)(this->InlineLiteral).regmatch.startp[0] -
                 (long)(this->InlineLiteral).regmatch.searchstring;
      if ((puVar8 == (ulong *)0x0) || (local_90 < *puVar8)) {
        puVar8 = &local_90;
      }
    }
    bVar3 = cmsys::RegularExpression::find
                      (&this->InlineLink,local_80._M_dataplus._M_p + lVar9,
                       &(this->InlineLink).regmatch);
    if ((bVar3) &&
       ((puVar8 == (ulong *)0x0 ||
        ((ulong)((long)(this->InlineLink).regmatch.startp[0] -
                (long)(this->InlineLink).regmatch.searchstring) < *puVar8)))) {
      poVar5 = this->OS;
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_d0,local_c8);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
      pcVar2 = (this->InlineLink).regmatch.startp[1];
      if (pcVar2 == (char *)0x0) {
        lVar6 = (long)(this->InlineLink).regmatch.endp[0] -
                (long)(this->InlineLink).regmatch.searchstring;
      }
      else {
        local_d0 = &local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,pcVar2,(this->InlineLink).regmatch.endp[1]);
        lVar6 = local_c8;
        pcVar2 = local_d0;
        if (local_c8 != 0) {
          lVar7 = 0;
          bVar3 = false;
          do {
            cVar1 = pcVar2[lVar7];
            if (bVar3) {
              local_b0 = (undefined1 *)CONCAT71(local_b0._1_7_,cVar1);
              std::__ostream_insert<char,std::char_traits<char>>(this->OS,(char *)&local_b0,1);
LAB_0014b8f7:
              bVar3 = false;
            }
            else {
              bVar3 = true;
              if (cVar1 != '\\') {
                local_b0 = (undefined1 *)CONCAT71(local_b0._1_7_,cVar1);
                std::__ostream_insert<char,std::char_traits<char>>(this->OS,(char *)&local_b0,1);
                goto LAB_0014b8f7;
              }
            }
            lVar7 = lVar7 + 1;
          } while (lVar6 != lVar7);
        }
        lVar6 = (long)(this->InlineLink).regmatch.endp[0] -
                (long)(this->InlineLink).regmatch.searchstring;
        if (local_d0 != &local_c0) {
          lVar7 = CONCAT71(uStack_bf,local_c0);
          goto LAB_0014bc3e;
        }
      }
    }
    else {
      if (puVar8 == &local_88) {
        poVar5 = this->OS;
        std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_80);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_d0,local_c8);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
        }
        pcVar2 = (this->CMakeRole).regmatch.startp[3];
        if (pcVar2 == (char *)0x0) {
          local_c8 = 0;
          local_c0 = '\0';
          local_d0 = &local_c0;
        }
        else {
          local_d0 = &local_c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,pcVar2,(this->CMakeRole).regmatch.endp[3]);
        }
        pcVar2 = (this->CMakeRole).regmatch.startp[2];
        if (pcVar2 == (char *)0x0) {
          local_b0 = &local_a0;
          local_a8 = 0;
          local_a0 = 0;
        }
        else {
          local_b0 = &local_a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,pcVar2,(this->CMakeRole).regmatch.endp[2]);
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar4 == 0) {
          pcVar2 = (this->CMakeRole).regmatch.startp[5];
          if (pcVar2 == (char *)0x0) {
            local_60 = &local_50;
            local_58 = 0;
            local_50 = 0;
LAB_0014bb6d:
            lVar6 = std::__cxx11::string::find_first_of((char *)&local_d0,0x496b9c,0);
            bVar3 = lVar6 == -1;
          }
          else {
            local_60 = &local_50;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_60,pcVar2,(this->CMakeRole).regmatch.endp[5]);
            if (local_58 == 0) goto LAB_0014bb6d;
            bVar3 = false;
          }
          if (local_60 != &local_50) {
            operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
          }
        }
        else {
          bVar3 = false;
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
        }
        if (bVar3) {
          std::__cxx11::string::append((char *)&local_d0);
        }
        poVar5 = this->OS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"``",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"``",2);
        lVar6 = (long)(this->CMakeRole).regmatch.endp[0] -
                (long)(this->CMakeRole).regmatch.searchstring;
      }
      else {
        if (puVar8 != &local_90) {
          poVar5 = this->OS;
          std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_80);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_d0,local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          return;
        }
        poVar5 = this->OS;
        std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_80);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_d0,local_c8);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
        }
        pcVar2 = (this->InlineLiteral).regmatch.startp[1];
        if (pcVar2 == (char *)0x0) {
          local_c8 = 0;
          local_c0 = '\0';
          local_d0 = &local_c0;
        }
        else {
          local_d0 = &local_c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,pcVar2,(this->InlineLiteral).regmatch.endp[1]);
        }
        lVar6 = (long)(this->InlineLiteral).regmatch.endp[0] -
                (long)(this->InlineLiteral).regmatch.searchstring;
        poVar5 = this->OS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"``",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"``",2);
      }
      if (local_d0 != &local_c0) {
        lVar7 = CONCAT71(uStack_bf,local_c0);
LAB_0014bc3e:
        operator_delete(local_d0,lVar7 + 1);
      }
    }
    lVar9 = lVar9 + lVar6;
  } while( true );
}

Assistant:

void cmRST::OutputLine(std::string const& line_in, bool inlineMarkup)
{
  if (this->OutputLinePending) {
    this->OS << "\n";
    this->OutputLinePending = false;
  }
  if (inlineMarkup) {
    std::string line = this->ReplaceSubstitutions(line_in);
    std::string::size_type pos = 0;
    for (;;) {
      std::string::size_type* first = nullptr;
      std::string::size_type role_start = std::string::npos;
      std::string::size_type link_start = std::string::npos;
      std::string::size_type lit_start = std::string::npos;
      if (this->CMakeRole.find(line.c_str() + pos)) {
        role_start = this->CMakeRole.start();
        first = &role_start;
      }
      if (this->InlineLiteral.find(line.c_str() + pos)) {
        lit_start = this->InlineLiteral.start();
        if (!first || lit_start < *first) {
          first = &lit_start;
        }
      }
      if (this->InlineLink.find(line.c_str() + pos)) {
        link_start = this->InlineLink.start();
        if (!first || link_start < *first) {
          first = &link_start;
        }
      }
      if (first == &role_start) {
        this->OS << line.substr(pos, role_start);
        std::string text = this->CMakeRole.match(3);
        // If a command reference has no explicit target and
        // no explicit "(...)" then add "()" to the text.
        if (this->CMakeRole.match(2) == "command" &&
            this->CMakeRole.match(5).empty() &&
            text.find_first_of("()") == std::string::npos) {
          text += "()";
        }
        this->OS << "``" << text << "``";
        pos += this->CMakeRole.end();
      } else if (first == &lit_start) {
        this->OS << line.substr(pos, lit_start);
        std::string text = this->InlineLiteral.match(1);
        pos += this->InlineLiteral.end();
        this->OS << "``" << text << "``";
      } else if (first == &link_start) {
        this->OS << line.substr(pos, link_start);
        std::string text = this->InlineLink.match(1);
        bool escaped = false;
        for (char c : text) {
          if (escaped) {
            escaped = false;
            this->OS << c;
          } else if (c == '\\') {
            escaped = true;
          } else {
            this->OS << c;
          }
        }
        pos += this->InlineLink.end();
      } else {
        break;
      }
    }
    this->OS << line.substr(pos) << "\n";
  } else {
    this->OS << line_in << "\n";
  }
}